

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

NodePtr __thiscall dh::analysis::cond_and_expr(analysis *this)

{
  _Alloc_hider this_00;
  size_type sVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  TreeNode *pTVar4;
  int iVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  analysis *in_RSI;
  NodePtr NVar7;
  NodePtr tmp_in_ptr;
  NodePtr tmp_ptr;
  NodePtr tmp_cur_ptr;
  int local_d0;
  undefined1 local_c9;
  string local_c8;
  element_type *local_a8;
  NodePtr local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  const_iterator local_88;
  TreeNode *local_80;
  analysis *local_78;
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  equality_expr((analysis *)&local_a0);
  token::getVal_abi_cxx11_
            (&local_c8,
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iVar5 = std::__cxx11::string::compare((char *)&local_c8);
  _Var6._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
    _Var6._M_pi = extraout_RDX_00;
  }
  _Var3._M_pi = local_a0.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  if (iVar5 == 0) {
    iVar5 = token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
    local_90._M_pi._0_4_ = iVar5;
    local_c8._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,char_const(&)[3],int>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_string_length,
               (TreeNode **)&local_c8,(allocator<dh::TreeNode> *)&local_d0,(char (*) [3])"&&",
               (int *)&local_90);
    sVar1 = local_c8._M_string_length;
    this_00._M_p = local_c8._M_dataplus._M_p;
    local_c8._M_string_length = 0;
    local_c8._M_dataplus._M_p = (pointer)0x0;
    local_40._M_allocated_capacity._0_2_ = 0x2626;
    local_50._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
    local_40._M_local_buf[2] = '\0';
    local_a8 = (element_type *)sVar1;
    local_50._M_allocated_capacity = (size_type)&local_40;
    match(in_RSI,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_allocated_capacity != &local_40) {
      operator_delete((void *)local_50._M_allocated_capacity);
    }
    local_c8._M_dataplus._M_p._0_4_ = 1;
    TreeNode::setNodeKind((TreeNode *)this_00._M_p,(int *)&local_c8);
    local_c8._M_dataplus._M_p._0_4_ = 2;
    TreeNode::setKind((TreeNode *)this_00._M_p,(int *)&local_c8);
    TreeNode::appendChild((TreeNode *)this_00._M_p,&local_a0);
    local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_p;
    local_88._M_current = (token *)sVar1;
    if ((element_type *)sVar1 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((shared_ptr<dh::symTab> *)(sVar1 + 8))->
                 super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             *(int *)&(((shared_ptr<dh::symTab> *)(sVar1 + 8))->
                      super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((shared_ptr<dh::symTab> *)(sVar1 + 8))->
                 super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             *(int *)&(((shared_ptr<dh::symTab> *)(sVar1 + 8))->
                      super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
      }
    }
    local_80 = (TreeNode *)this_00._M_p;
    local_78 = this;
    while( true ) {
      equality_expr((analysis *)&local_c8);
      _Var6._M_pi = local_a0.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_a0.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length;
      local_a0.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_c8._M_dataplus._M_p;
      local_c8._M_dataplus._M_p = (pointer)0x0;
      local_c8._M_string_length = 0;
      if ((element_type *)_Var6._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
      }
      if ((element_type *)local_c8._M_string_length != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length);
      }
      token::getVal_abi_cxx11_
                (&local_c8,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      iVar5 = std::__cxx11::string::compare((char *)&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if (iVar5 != 0) break;
      local_d0 = token::getLineno((in_RSI->tmp).
                                  super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_c8._M_dataplus._M_p = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,char_const(&)[3],int>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_string_length,
                 (TreeNode **)&local_c8,(allocator<dh::TreeNode> *)&local_c9,(char (*) [3])"&&",
                 &local_d0);
      local_70._16_2_ = 0x2626;
      local_70._8_8_ = (element_type *)0x2;
      local_70[0x12] = '\0';
      local_70._0_8_ = (pointer)(local_70 + 0x10);
      match(in_RSI,(string *)local_70);
      if ((pointer)local_70._0_8_ != (pointer)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_);
      }
      local_d0 = 1;
      TreeNode::setNodeKind((TreeNode *)local_c8._M_dataplus._M_p,&local_d0);
      local_d0 = 2;
      TreeNode::setKind((TreeNode *)local_c8._M_dataplus._M_p,&local_d0);
      TreeNode::appendChild((TreeNode *)local_c8._M_dataplus._M_p,&local_a0);
      TreeNode::appendChild((TreeNode *)local_90._M_pi,(NodePtr *)&local_c8);
      local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_dataplus._M_p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_string_length);
      if ((element_type *)local_c8._M_string_length != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length);
      }
    }
    TreeNode::appendChild((TreeNode *)local_90._M_pi,&local_a0);
    this = local_78;
    pTVar4 = local_80;
    peVar2 = local_a8;
    _Var6._M_pi = extraout_RDX_01;
    if ((element_type *)local_88._M_current != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_current);
      _Var6._M_pi = extraout_RDX_02;
    }
    *(TreeNode **)this = pTVar4;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  }
  else {
    *(element_type **)this =
         local_a0.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_a0.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var3._M_pi;
    local_a0.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (TreeNode *)0x0;
  }
  if ((element_type *)
      local_a0.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var6._M_pi = extraout_RDX_03;
  }
  NVar7.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi
  ;
  NVar7.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar7.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::cond_and_expr()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in cond_and_expr\n";
#endif
	
	NodePtr ret;
	NodePtr tmp_ptr = equality_expr();

	if ( tmp->getVal() == "&&")
	{
		ret = ::std::make_shared<TreeNode>("&&",tmp->getLineno());
		match("&&");
		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::CondAndK);
		ret->appendChild(tmp_ptr);

		NodePtr tmp_cur_ptr = ret;
		while (1)
		{
			tmp_ptr = equality_expr();

			if ( tmp->getVal() == "&&")
			{
				NodePtr tmp_in_ptr = ::std::make_shared<TreeNode>("&&",tmp->getLineno());
				match("&&");
				tmp_in_ptr->setNodeKind(NodeKind::ExprK);
				tmp_in_ptr->setKind(ExprKind::CondAndK);
				tmp_in_ptr->appendChild(tmp_ptr);

				tmp_cur_ptr->appendChild(tmp_in_ptr);
				tmp_cur_ptr = tmp_in_ptr;
			} else 
			{
				tmp_cur_ptr->appendChild(tmp_ptr);
				break;
			}
		}

	} else 
	{
		return tmp_ptr;
	}

	return ret;
}